

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::maxSI8x16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *this_00;
  Literal *val;
  Literal *this_01;
  long lVar1;
  undefined1 local_360 [8];
  LaneArray<16> other_lanes;
  LaneArray<16> lanes;
  Literal local_48;
  
  getLanes<signed_char,16>((LaneArray<16> *)&other_lanes._M_elems[0xf].type,(wasm *)this,other);
  getLanes<signed_char,16>((LaneArray<16> *)local_360,(wasm *)other,val);
  this_00 = &lanes._M_elems[0xf].type;
  for (lVar1 = 0; lVar1 != 0x180; lVar1 = lVar1 + 0x18) {
    this_01 = (Literal *)((long)lanes._M_elems + lVar1 + -8);
    maxInt(&local_48,this_01,(Literal *)(local_360 + lVar1));
    Literal((Literal *)this_00,&local_48);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_48);
  }
  Literal(__return_storage_ptr__,(LaneArray<16> *)&other_lanes._M_elems[0xf].type);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_360);
  std::array<wasm::Literal,_16UL>::~array
            ((array<wasm::Literal,_16UL> *)&other_lanes._M_elems[0xf].type);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::maxSI8x16(const Literal& other) const {
  return binary<16, &Literal::getLanesSI8x16, &Literal::maxInt>(*this, other);
}